

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chop.cpp
# Opt level: O2

handle_t handlegraph::algorithms::combine_handles
                   (MutablePathDeletableHandleGraph *graph,
                   vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *handles)

{
  pointer phVar1;
  long lVar2;
  pointer phVar3;
  bool bVar4;
  handle_t *phVar5;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  long lVar6;
  handle_t *handle;
  pointer phVar7;
  handle_t combined;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_fwd_rev;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *local_b0;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_fwd_fwd;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_rev_rev;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_rev_fwd;
  string seq;
  
  seq._M_dataplus._M_p = (pointer)&seq.field_2;
  seq._M_string_length = 0;
  seq.field_2._M_local_buf[0] = '\0';
  phVar1 = (handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (phVar7 = (handles->
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                _M_impl.super__Vector_impl_data._M_start; phVar7 != phVar1; phVar7 = phVar7 + 1) {
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x40))
              (&local_e8,&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),phVar7);
    std::__cxx11::string::append((string *)&seq);
    std::__cxx11::string::~string((string *)local_e8._M_pod_data);
  }
  combined.data =
       (char  [8])
       (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0)) + 0xa0))
                 (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0),&seq);
  local_b0 = &edges_fwd_fwd;
  edges_fwd_fwd.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges_fwd_fwd.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  edges_fwd_fwd.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_fwd_rev.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges_fwd_rev.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  edges_fwd_rev.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_rev_fwd.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges_rev_fwd.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  edges_rev_fwd.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges_rev_rev.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  edges_rev_rev.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  edges_rev_rev.super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._8_8_ = 0;
  local_d0 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_e8._M_unused._M_object = &local_b0;
  (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
            (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
             (handles->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_finish + -1,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  local_e8._8_8_ = 0;
  local_b0 = &edges_fwd_rev;
  local_d0 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_e8._M_unused._M_object = &local_b0;
  (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
            (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
             (handles->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_start,1,&local_e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  phVar1 = (handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (phVar7 = (handles->
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                _M_impl.super__Vector_impl_data._M_start;
      phVar3 = edges_fwd_fwd.
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
               _M_impl.super__Vector_impl_data._M_finish, phVar7 != phVar1; phVar7 = phVar7 + 1) {
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0xf8))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),phVar7);
  }
  for (phVar7 = edges_fwd_fwd.
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      phVar1 = edges_fwd_rev.
               super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>.
               _M_impl.super__Vector_impl_data._M_finish, phVar7 != phVar3; phVar7 = phVar7 + 1) {
    bVar4 = operator==(phVar7,(handles->
                              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                              )._M_impl.super__Vector_impl_data._M_start);
    if (bVar4) {
      lVar6 = *(long *)(*(long *)graph + -0x1d0);
      phVar5 = &combined;
LAB_0017afc7:
      (**(code **)(*(long *)(&graph->field_0x0 + lVar6) + 0xb0))
                (&graph->field_0x0 + lVar6,&combined,phVar5);
    }
    else {
      local_e8._M_unused._0_8_ =
           (undefined8)
           (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x30))
                     (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
                      (handles->
                      super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1);
      bVar4 = operator==(phVar7,(handle_t *)&local_e8);
      lVar6 = *(long *)(*(long *)graph + -0x1d0);
      phVar5 = phVar7;
      if (!bVar4) goto LAB_0017afc7;
      lVar2 = *(long *)(*(long *)graph + -0xb0);
      local_e8._M_unused._0_8_ =
           (undefined8)
           (**(code **)(*(long *)(&graph->field_0x0 + lVar2) + 0x30))
                     (&graph->field_0x0 + lVar2,&combined);
      (**(code **)(*(long *)(&graph->field_0x0 + lVar6) + 0xb0))
                (&graph->field_0x0 + lVar6,&combined,&local_e8);
    }
  }
  phVar7 = edges_fwd_rev.
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (phVar7 == phVar1) {
      std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      ~_Vector_base(&edges_rev_rev.
                     super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                   );
      std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      ~_Vector_base(&edges_rev_fwd.
                     super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                   );
      std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      ~_Vector_base(&edges_fwd_rev.
                     super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                   );
      std::_Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>::
      ~_Vector_base(&edges_fwd_fwd.
                     super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                   );
      std::__cxx11::string::~string((string *)&seq);
      return (handle_t)combined.data;
    }
    bVar4 = operator==(phVar7,(handles->
                              super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1);
    if (bVar4) {
      lVar6 = *(long *)(*(long *)graph + -0x1d0);
      phVar5 = &combined;
LAB_0017b089:
      (**(code **)(*(long *)(&graph->field_0x0 + lVar6) + 0xb0))
                (&graph->field_0x0 + lVar6,phVar5,&combined);
    }
    else {
      local_e8._M_unused._0_8_ =
           (undefined8)
           (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x30))
                     (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
                      (handles->
                      super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                      )._M_impl.super__Vector_impl_data._M_start);
      bVar4 = operator==(phVar7,(handle_t *)&local_e8);
      lVar6 = *(long *)(*(long *)graph + -0x1d0);
      phVar5 = phVar7;
      if (!bVar4) goto LAB_0017b089;
      lVar2 = *(long *)(*(long *)graph + -0xb0);
      local_e8._M_unused._0_8_ =
           (undefined8)
           (**(code **)(*(long *)(&graph->field_0x0 + lVar2) + 0x30))
                     (&graph->field_0x0 + lVar2,&combined);
      (**(code **)(*(long *)(&graph->field_0x0 + lVar6) + 0xb0))
                (&graph->field_0x0 + lVar6,&local_e8,&combined);
    }
    phVar7 = phVar7 + 1;
  } while( true );
}

Assistant:

handle_t combine_handles(MutablePathDeletableHandleGraph& graph,
                         const std::vector<handle_t>& handles) {
    std::string seq;
    for (auto& handle : handles) {
        seq.append(graph.get_sequence(handle));
    }
    handle_t combined = graph.create_handle(seq);
    // relink the inbound and outbound nodes
    // get the edge context
    std::vector<handle_t> edges_fwd_fwd;
    std::vector<handle_t> edges_fwd_rev;
    std::vector<handle_t> edges_rev_fwd;
    std::vector<handle_t> edges_rev_rev;
    graph.follow_edges(
                       handles.back(), false,
                       [&](const handle_t& h) {
        edges_fwd_fwd.push_back(h);
    });
    graph.follow_edges(
                       handles.front(), true,
                       [&](const handle_t& h) {
        edges_fwd_rev.push_back(h);
    });
    // destroy the old handles
    for (auto& handle : handles) {
        graph.destroy_handle(handle);
    }
    // connect the ends to the previous context
    // check that we're not trying to make edges that connect back with the nodes in the component
    // there are three cases
    // self looping, front and rear inverting
    for (auto& h : edges_fwd_fwd) {
        if (h == handles.front()) {
            graph.create_edge(combined, combined);
        } else if (h == graph.flip(handles.back())) {
            graph.create_edge(combined, graph.flip(combined));
        } else {
            graph.create_edge(combined, h);
        }
    }
    for (auto& h : edges_fwd_rev) {
        if (h == handles.back()) {
            graph.create_edge(combined, combined);
        } else if (h == graph.flip(handles.front())) {
            graph.create_edge(graph.flip(combined), combined);
        } else {
            graph.create_edge(h, combined);
        }
    }
    return combined;
}